

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portal.cpp
# Opt level: O2

void P_TranslatePortalVXVY(line_t_conflict *src,double *velx,double *vely)

{
  double dVar1;
  double dVar2;
  FLinePortal *port;
  
  if ((src != (line_t_conflict *)0x0) &&
     (linePortals.Array != (FLinePortal *)0x0 && src->portalindex < linePortals.Count)) {
    port = linePortals.Array + src->portalindex;
    if ((port->mFlags & 0x10) != 0) {
      SetRotation(port);
    }
    dVar1 = *velx;
    dVar2 = *vely;
    *velx = dVar1 * port->mCosRot - dVar2 * port->mSinRot;
    *vely = dVar2 * port->mCosRot + dVar1 * port->mSinRot;
  }
  return;
}

Assistant:

void P_TranslatePortalVXVY(line_t* src, double &velx, double &vely)
{
	if (!src) return;
	FLinePortal *port = src->getPortal();
	if (!port) return;
	if (port->mFlags & PORTF_POLYOBJ) SetRotation(port);	// update the angle for polyportals.

	double orig_velx = velx;
	double orig_vely = vely;
	velx = orig_velx * port->mCosRot - orig_vely * port->mSinRot;
	vely = orig_vely * port->mCosRot + orig_velx * port->mSinRot;
}